

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,Level level,string_t *format)

{
  string *in_RDX;
  undefined4 in_ESI;
  Loggable *in_RDI;
  string_t *in_stack_00000008;
  LogFormat *in_stack_00000010;
  
  Loggable::Loggable(in_RDI);
  in_RDI->_vptr_Loggable = (_func_int **)&PTR__LogFormat_002d4190;
  *(undefined4 *)&in_RDI[1]._vptr_Loggable = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 10));
  utils::OS::currentUser_abi_cxx11_();
  utils::OS::currentHost_abi_cxx11_();
  parseFromFormat(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

LogFormat::LogFormat(Level level, const base::type::string_t& format)
  : m_level(level), m_userFormat(format), m_currentUser(base::utils::OS::currentUser()),
    m_currentHost(base::utils::OS::currentHost()) {
  parseFromFormat(m_userFormat);
}